

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec3<int>>(char *type)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  int *piVar7;
  char *in_RDI;
  Box<Imath_3_2::Vec3<int>_> b_1;
  Vec3<int> max;
  Vec3<int> min;
  Box<Imath_3_2::Vec3<int>_> b1;
  int hi;
  int lo;
  uint i;
  Vec3<int> p1;
  Vec3<int> p0;
  Box<Imath_3_2::Vec3<int>_> b0;
  Box<Imath_3_2::Vec3<int>_> b;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Vec3<int> *in_stack_ffffffffffffff48;
  Box<Imath_3_2::Vec3<int>_> *in_stack_ffffffffffffff50;
  Box<Imath_3_2::Vec3<int>_> *in_stack_ffffffffffffff58;
  Vec3<int> local_98 [3];
  int local_74;
  int local_70;
  uint local_6c;
  Vec3<int> local_68;
  Vec3<int> local_5c;
  Vec3<int> local_50;
  Vec3<int> local_44 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar6 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar6 = std::operator<<(poVar6,local_8);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            ((Box<Imath_3_2::Vec3<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::makeInfinite(in_stack_ffffffffffffff50);
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::isInfinite(in_stack_ffffffffffffff58);
  if (!bVar3) {
    __assert_fail("b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x318,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<int>]"
                 );
  }
  Imath_3_2::Vec3<int>::Vec3(local_44,-1);
  Imath_3_2::Vec3<int>::Vec3(&local_50,1);
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::isInfinite(in_stack_ffffffffffffff58);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x323,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<int>]"
                 );
  }
  Imath_3_2::Vec3<int>::Vec3(&local_5c);
  Imath_3_2::Vec3<int>::Vec3(&local_68);
  local_6c = 0;
  while( true ) {
    uVar5 = local_6c;
    uVar4 = Imath_3_2::Vec3<int>::dimensions();
    if (uVar4 <= uVar5) break;
    local_70 = 1 << ((char)local_6c + 1U & 0x1f);
    uVar5 = Imath_3_2::Vec3<int>::dimensions();
    local_74 = 1 << ((char)uVar5 - (char)local_6c & 0x1fU);
    iVar1 = -local_70;
    piVar7 = Imath_3_2::Vec3<int>::operator[](&local_5c,local_6c);
    iVar2 = local_74;
    *piVar7 = iVar1;
    piVar7 = Imath_3_2::Vec3<int>::operator[](&local_68,local_6c);
    *piVar7 = iVar2;
    local_6c = local_6c + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff44,uVar5));
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::isInfinite(in_stack_ffffffffffffff58);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x32f,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<int>]"
                 );
  }
  Imath_3_2::Vec3<int>::Vec3(local_98,0);
  Imath_3_2::Vec3<int>::Vec3((Vec3<int> *)&stack0xffffffffffffff5c,local_98);
  uVar4 = Imath_3_2::Vec3<int>::dimensions();
  piVar7 = Imath_3_2::Vec3<int>::operator[]((Vec3<int> *)&stack0xffffffffffffff5c,uVar4 - 1);
  *piVar7 = 2;
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (Vec3<int> *)CONCAT44(in_stack_ffffffffffffff44,uVar5));
  bVar3 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::isInfinite(in_stack_ffffffffffffff58);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x340,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec3<int>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite (const char* type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite ();
        assert (b.isInfinite ());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (!b0.isInfinite ());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (!b1.isInfinite ());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (!b.isInfinite ());
    }
}